

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void glist_glist(_glist *g,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *sym;
  _glist *p_Var1;
  _glist *x;
  void *data;
  t_float x1;
  t_float y1;
  t_float x2;
  t_float y2;
  t_float px1;
  t_float py1;
  t_float px2;
  t_float py2;
  
  sym = atom_getsymbolarg(0,argc,argv);
  x1 = atom_getfloatarg(1,argc,argv);
  y1 = atom_getfloatarg(2,argc,argv);
  x2 = atom_getfloatarg(3,argc,argv);
  y2 = atom_getfloatarg(4,argc,argv);
  px1 = atom_getfloatarg(5,argc,argv);
  py1 = atom_getfloatarg(6,argc,argv);
  px2 = atom_getfloatarg(7,argc,argv);
  py2 = atom_getfloatarg(8,argc,argv);
  p_Var1 = glist_addglist(g,sym,x1,y1,x2,y2,px1,py1,px2,py2);
  p_Var1 = glist_getcanvas(p_Var1);
  if (*(int *)&(((_glist *)p_Var1->gl_privatedata)->gl_obj).te_outlet != 0) {
    return;
  }
  p_Var1 = glist_getcanvas((_glist *)p_Var1->gl_privatedata);
  x = glist_getcanvas(p_Var1);
  data = canvas_undo_set_create(x);
  canvas_undo_add(p_Var1,UNDO_CREATE,"create",data);
  return;
}

Assistant:

void glist_glist(t_glist *g, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *sym = atom_getsymbolarg(0, argc, argv);
    t_float x1 = atom_getfloatarg(1, argc, argv);
    t_float y1 = atom_getfloatarg(2, argc, argv);
    t_float x2 = atom_getfloatarg(3, argc, argv);
    t_float y2 = atom_getfloatarg(4, argc, argv);
    t_float px1 = atom_getfloatarg(5, argc, argv);
    t_float py1 = atom_getfloatarg(6, argc, argv);
    t_float px2 = atom_getfloatarg(7, argc, argv);
    t_float py2 = atom_getfloatarg(8, argc, argv);
    glist_addglist(g, sym, x1, y1, x2, y2, px1, py1, px2, py2);
    if (!canvas_undo_get(glist_getcanvas(g))->u_doing)
        canvas_undo_add(glist_getcanvas(g), UNDO_CREATE, "create",
            (void *)canvas_undo_set_create(glist_getcanvas(g)));
}